

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TtManStop(Abc_TtMan_t *p)

{
  Vec_Mem_t *pVVar1;
  word *__ptr;
  int i_1;
  long lVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    pVVar1 = p->vTtMem[lVar3];
    if (pVVar1 != (Vec_Mem_t *)0x0) {
      Vec_IntFreeP(&pVVar1->vTable);
      Vec_IntFreeP(&pVVar1->vNexts);
      pVVar1 = p->vTtMem[lVar3];
      if (pVVar1 != (Vec_Mem_t *)0x0) {
        for (lVar2 = 0; lVar2 <= pVVar1->iPage; lVar2 = lVar2 + 1) {
          __ptr = pVVar1->ppPages[lVar2];
          if (__ptr != (word *)0x0) {
            free(__ptr);
            pVVar1->ppPages[lVar2] = (word *)0x0;
          }
        }
        free(pVVar1->ppPages);
        free(pVVar1);
        p->vTtMem[lVar3] = (Vec_Mem_t *)0x0;
      }
    }
  }
  free(p);
  return;
}

Assistant:

void Abc_TtManStop( Abc_TtMan_t * p )
{
    int i;
    for ( i = 0; i < TT_NUM_TABLES; i++ )
    {
        Vec_MemHashFree( p->vTtMem[i] );
        Vec_MemFreeP( &p->vTtMem[i] );
    }
    ABC_FREE( p );
}